

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export_fixups.cpp
# Opt level: O0

czstring pstore::exchange::export_ns::emit_section_name(section_kind section)

{
  char *local_18;
  char *result;
  section_kind section_local;
  
  local_18 = "unknown";
  switch(section) {
  case text:
    local_18 = "text";
    break;
  case data:
    local_18 = "data";
    break;
  case bss:
    local_18 = "bss";
    break;
  case rel_ro:
    local_18 = "rel_ro";
    break;
  case mergeable_1_byte_c_string:
    local_18 = "mergeable_1_byte_c_string";
    break;
  case mergeable_2_byte_c_string:
    local_18 = "mergeable_2_byte_c_string";
    break;
  case mergeable_4_byte_c_string:
    local_18 = "mergeable_4_byte_c_string";
    break;
  case mergeable_const_4:
    local_18 = "mergeable_const_4";
    break;
  case mergeable_const_8:
    local_18 = "mergeable_const_8";
    break;
  case mergeable_const_16:
    local_18 = "mergeable_const_16";
    break;
  case mergeable_const_32:
    local_18 = "mergeable_const_32";
    break;
  case read_only:
    local_18 = "read_only";
    break;
  case thread_data:
    local_18 = "thread_data";
    break;
  case thread_bss:
    local_18 = "thread_bss";
    break;
  case debug_line:
    local_18 = "debug_line";
    break;
  case debug_loc:
    local_18 = "debug_loc";
    break;
  case debug_string:
    local_18 = "debug_string";
    break;
  case debug_ranges:
    local_18 = "debug_ranges";
    break;
  case linked_definitions:
    local_18 = "linked_definitions";
    break;
  case last:
  }
  return local_18;
}

Assistant:

gsl::czstring emit_section_name (repo::section_kind const section) noexcept {
                auto const * result = "unknown";
#define X(a)                                                                                       \
    case pstore::repo::section_kind::a: result = #a; break;
                switch (section) {
                    PSTORE_MCREPO_SECTION_KINDS
                case pstore::repo::section_kind::last: break;
                }
#undef X
                return result;
            }